

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O0

int Cudd_DumpBlifBody(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp,int mv)

{
  int iVar1;
  st__table *table;
  char *pcVar2;
  uint local_50;
  int local_4c;
  int i;
  int retval;
  st__table *visited;
  FILE *fp_local;
  char **onames_local;
  char **inames_local;
  DdNode **f_local;
  int n_local;
  DdManager *dd_local;
  
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) {
LAB_00a790ed:
    if (table != (st__table *)0x0) {
      st__free_table(table);
    }
    dd_local._4_4_ = 0;
  }
  else {
    for (local_50 = 0; (int)local_50 < n; local_50 = local_50 + 1) {
      iVar1 = ddDoDumpBlif(dd,(DdNode *)((ulong)f[(int)local_50] & 0xfffffffffffffffe),fp,table,
                           inames,mv);
      if (iVar1 == 0) goto LAB_00a790ed;
    }
    for (local_50 = 0; (int)local_50 < n; local_50 = local_50 + 1) {
      if (onames == (char **)0x0) {
        local_4c = fprintf((FILE *)fp,".names %lx f%d\n",(ulong)f[(int)local_50] / 0x28,
                           (ulong)local_50);
      }
      else {
        local_4c = fprintf((FILE *)fp,".names %lx %s\n",(ulong)f[(int)local_50] / 0x28,
                           onames[(int)local_50]);
      }
      if (local_4c == -1) goto LAB_00a790ed;
      if (((ulong)f[(int)local_50] & 1) == 0) {
        pcVar2 = "";
        if (mv != 0) {
          pcVar2 = ".def 0\n";
        }
        local_4c = fprintf((FILE *)fp,"%s1 1\n",pcVar2);
      }
      else {
        pcVar2 = "";
        if (mv != 0) {
          pcVar2 = ".def 0\n";
        }
        local_4c = fprintf((FILE *)fp,"%s0 1\n",pcVar2);
      }
      if (local_4c == -1) goto LAB_00a790ed;
    }
    st__free_table(table);
    dd_local._4_4_ = 1;
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_DumpBlifBody(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */,
  int mv /* 0: blif, 1: blif-MV */)
{
    st__table    *visited = NULL;
    int         retval;
    int         i;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        retval = ddDoDumpBlif(dd,Cudd_Regular(f[i]),fp,visited,inames,mv);
        if (retval == 0) goto failure;
    }

    /* To account for the possible complement on the root,
    ** we put either a buffer or an inverter at the output of
    ** the multiplexer representing the top node.
    */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,
#if SIZEOF_VOID_P == 8
                ".names %lx f%d\n", (ptruint) f[i] / (ptruint) sizeof(DdNode), i);
#else
                ".names %x f%d\n", (ptruint) f[i] / (ptruint) sizeof(DdNode), i);
#endif
        } else {
            retval = fprintf(fp,
#if SIZEOF_VOID_P == 8
                ".names %lx %s\n", (ptruint) f[i] / (ptruint) sizeof(DdNode), onames[i]);
#else
                ".names %x %s\n", (ptruint) f[i] / (ptruint) sizeof(DdNode), onames[i]);
#endif
        }
        if (retval == EOF) goto failure;
        if (Cudd_IsComplement(f[i])) {
            retval = fprintf(fp,"%s0 1\n", mv ? ".def 0\n" : "");
        } else {
            retval = fprintf(fp,"%s1 1\n", mv ? ".def 0\n" : "");
        }
        if (retval == EOF) goto failure;
    }

    st__free_table(visited);
    return(1);

failure:
    if (visited != NULL) st__free_table(visited);
    return(0);

}